

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void on_recv_data(connection *conn)

{
  size_t *psVar1;
  mg_connection *ri;
  uint *puVar2;
  int iVar3;
  ns_connection *pnVar4;
  mg_handler_t p_Var5;
  byte *pbVar6;
  byte bVar7;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  int iVar14;
  endpoint_type eVar15;
  uint uVar16;
  uint uVar17;
  char *pcVar18;
  char *pcVar19;
  size_t sVar20;
  uchar *puVar21;
  long lVar22;
  __int32_t **pp_Var23;
  byte *pbVar24;
  connection *conn_1;
  byte bVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  ns_connection *pnVar30;
  uint uVar31;
  undefined1 auVar32 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uchar c;
  char sha [20];
  char b64_sha [40];
  unsigned_short n;
  uchar local_2d9;
  byte abStack_2d8 [32];
  uchar local_2b8 [27];
  undefined2 local_29d;
  SHA1_CTX local_288;
  uchar local_228 [504];
  byte bVar8;
  byte bVar9;
  
  pnVar4 = conn->ns_conn;
  if (conn->endpoint_type == EP_PROXY) {
    if ((conn->endpoint).nc == (ns_connection *)0x0) {
      return;
    }
    ns_out((conn->endpoint).nc,(pnVar4->recv_iobuf).buf,(long)(int)(pnVar4->recv_iobuf).len);
    if ((pnVar4->recv_iobuf).len == 0) {
      return;
    }
    (pnVar4->recv_iobuf).len = 0;
    return;
  }
  try_parse(conn);
  if (conn->request_len < 0) {
LAB_0010b3a7:
    iVar14 = 400;
LAB_0010b3c3:
    send_http_error(conn,iVar14,(char *)0x0);
  }
  else if (conn->request_len == 0) {
LAB_0010b3b1:
    if (0x4000 < (pnVar4->recv_iobuf).len) {
      iVar14 = 0x19d;
      goto LAB_0010b3c3;
    }
  }
  else {
    pcVar18 = (conn->mg_conn).uri;
    if ((*pcVar18 == '/') ||
       (((*pcVar18 == '*' && (pcVar18[1] == '\0')) ||
        (iVar14 = mg_strncasecmp(pcVar18,"http",4), iVar14 == 0)))) {
LAB_0010b36b:
      pcVar18 = (conn->mg_conn).http_version;
      iVar14 = strcmp(pcVar18,"1.0");
      if ((iVar14 != 0) && (iVar14 = strcmp(pcVar18,"1.1"), iVar14 != 0)) {
        iVar14 = 0x1f9;
        goto LAB_0010b3c3;
      }
      eVar15 = conn->endpoint_type;
      if (eVar15 != EP_NONE) goto LAB_0010b3d2;
      ri = &conn->mg_conn;
      pcVar18 = mg_get_header(ri,"Sec-WebSocket-Version");
      pcVar19 = mg_get_header(ri,"Sec-WebSocket-Key");
      if (pcVar19 != (char *)0x0 && pcVar18 != (char *)0x0) {
        (conn->mg_conn).is_websocket = 1;
        if (((conn->server == (mg_server *)0x0) ||
            (p_Var5 = conn->server->event_handler, p_Var5 == (mg_handler_t)0x0)) ||
           (iVar14 = (*p_Var5)(ri,MG_WS_HANDSHAKE), iVar14 == 0)) {
          bVar25 = 0;
          mg_snprintf((char *)local_228,500,"%s%s",pcVar19,"258EAFA5-E914-47DA-95CA-C5AB0DC85B11");
          local_288.state[0] = 0x67452301;
          local_288.state[1] = 0xefcdab89;
          local_288.state[2] = 0x98badcfe;
          local_288.state[3] = 0x10325476;
          local_288.state[4] = 0xc3d2e1f0;
          local_288.count[0] = 0;
          local_288.count[1] = 0;
          sVar20 = strlen((char *)local_228);
          SHA1Update(&local_288,local_228,(uint32_t)sVar20);
          uVar28 = 0;
          do {
            local_2b8[uVar28] = (uchar)(local_288.count[uVar28 < 4] >> (~bVar25 & 0x18));
            uVar28 = uVar28 + 1;
            bVar25 = bVar25 + 8;
          } while (uVar28 != 8);
          local_2d9 = 0x80;
          SHA1Update(&local_288,&local_2d9,1);
          if ((local_288.count[0] & 0x1f8) != 0x1c0) {
            do {
              local_2d9 = '\0';
              SHA1Update(&local_288,&local_2d9,1);
            } while ((local_288.count[0] & 0x1f8) != 0x1c0);
          }
          SHA1Update(&local_288,local_2b8,8);
          uVar16 = 0;
          uVar31 = 1;
          uVar17 = 2;
          uVar27 = 3;
          lVar22 = 0;
          do {
            uVar26 = *(uint *)((long)local_288.state + lVar22);
            auVar32._0_4_ = (uVar16 ^ 0xffffffff) << 3;
            auVar32._4_4_ = (uVar31 ^ 0xffffffff) << 3;
            auVar32._8_4_ = (uVar17 ^ 0xffffffff) << 3;
            auVar32._12_4_ = (uVar27 ^ 0xffffffff) << 3;
            auVar32 = auVar32 & _DAT_0010f380;
            auVar33 = pshuflw(in_XMM7,auVar32,0xfe);
            uVar35 = uVar26 >> auVar33._0_8_;
            auVar34 = pshuflw(auVar33,auVar32,0x54);
            uVar37 = uVar26 >> auVar34._0_8_;
            auVar33._8_4_ = auVar32._8_4_;
            auVar33._12_4_ = auVar32._12_4_;
            auVar33._0_8_ = auVar32._8_8_;
            in_XMM7 = pshuflw(auVar34,auVar33,0xfe);
            uVar36 = uVar26 >> in_XMM7._0_8_;
            auVar32 = pshuflw(auVar33,auVar33,0x54);
            uVar26 = uVar26 >> auVar32._0_8_;
            uVar10 = (ushort)uVar37 & 0xff;
            uVar11 = (ushort)uVar35 & 0xff;
            uVar12 = (ushort)uVar26 & 0xff;
            uVar13 = (ushort)uVar36 & 0xff;
            bVar25 = ((uVar37 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar37 - (0xff < uVar10);
            bVar7 = ((uVar35 & 0xff) != 0) * (uVar11 < 0x100) * (char)uVar35 - (0xff < uVar11);
            bVar8 = ((uVar26 & 0xff) != 0) * (uVar12 < 0x100) * (char)uVar26 - (0xff < uVar12);
            bVar9 = ((uVar36 & 0xff) != 0) * (uVar13 < 0x100) * (char)uVar36 - (0xff < uVar13);
            *(uint *)(abStack_2d8 + lVar22) =
                 CONCAT13((bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9),
                          CONCAT12((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                                   CONCAT11((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                                            (bVar25 != 0) * (bVar25 < 0x100) * bVar25 -
                                            (0xff < bVar25))));
            lVar22 = lVar22 + 4;
            uVar16 = uVar16 + (int)DAT_0010f3a0;
            uVar31 = uVar31 + DAT_0010f3a0._4_4_;
            uVar17 = uVar17 + DAT_0010f3a0._8_4_;
            uVar27 = uVar27 + DAT_0010f3a0._12_4_;
          } while (lVar22 != 0x14);
          puVar21 = local_2b8 + 3;
          uVar28 = 0;
          while( true ) {
            uVar16 = 0;
            if (uVar28 < 0x12) {
              uVar16 = (uint)abStack_2d8[uVar28 + 2];
            }
            bVar25 = abStack_2d8[uVar28];
            bVar7 = abStack_2d8[uVar28 + 1];
            puVar21[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                          [bVar25 >> 2];
            puVar21[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                          [(uint)(bVar7 >> 4) | (bVar25 & 3) << 4];
            puVar21[-1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                          [(uVar16 >> 6) + (bVar7 & 0xf) * 4];
            if (0x11 < uVar28) break;
            *puVar21 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                       [uVar16 & 0x3f];
            uVar28 = uVar28 + 3;
            puVar21 = puVar21 + 4;
          }
          local_29d = 0x3d;
          mg_snprintf((char *)local_228,500,"%s%s%s",
                      "HTTP/1.1 101 Switching Protocols\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: "
                      ,local_2b8,"\r\n\r\n");
          sVar20 = strlen((char *)local_228);
          ns_out(conn->ns_conn,local_228,(long)(int)sVar20);
        }
        if ((conn->server != (mg_server *)0x0) &&
           (p_Var5 = conn->server->event_handler, p_Var5 != (mg_handler_t)0x0)) {
          (*p_Var5)(ri,MG_WS_CONNECT);
        }
      }
      pcVar18 = mg_get_header(ri,"Expect");
      if (pcVar18 != (char *)0x0) {
        pp_Var23 = __ctype_tolower_loc();
        lVar22 = 0;
        do {
          iVar14 = (*pp_Var23)[(byte)pcVar18[lVar22]];
          iVar3 = (*pp_Var23)[(byte)"100-continue"[lVar22]];
          if (pcVar18[lVar22] == 0) break;
          lVar22 = lVar22 + 1;
        } while (iVar14 == iVar3);
        if (iVar14 == iVar3) {
          ns_out(conn->ns_conn,"HTTP/1.1 100 Continue\r\n\r\n",0x19);
        }
      }
      open_local_endpoint(conn,0);
    }
    else {
      iVar14 = __isoc99_sscanf(pcVar18,"%*[^ :]:%hu",local_228);
      if (iVar14 < 1) goto LAB_0010b3a7;
      if (conn->request_len == 0) goto LAB_0010b3b1;
      if (0 < conn->request_len) goto LAB_0010b36b;
    }
  }
  eVar15 = conn->endpoint_type;
LAB_0010b3d2:
  if ((eVar15 == EP_CGI) && ((conn->endpoint).nc != (ns_connection *)0x0)) {
    pnVar30 = conn->ns_conn;
    ns_out((conn->endpoint).nc,(pnVar30->recv_iobuf).buf,(long)(int)(pnVar30->recv_iobuf).len);
    if ((pnVar30->recv_iobuf).len != 0) {
      (pnVar30->recv_iobuf).len = 0;
    }
  }
  eVar15 = conn->endpoint_type;
  if (eVar15 == EP_USER) {
    (conn->mg_conn).content = (pnVar4->recv_iobuf).buf;
    (conn->mg_conn).content_len = (pnVar4->recv_iobuf).len;
    if ((conn->server != (mg_server *)0x0) &&
       (p_Var5 = conn->server->event_handler, p_Var5 != (mg_handler_t)0x0)) {
      uVar16 = (*p_Var5)(&conn->mg_conn,MG_RECV);
      if ((int)uVar16 < 0) {
        puVar2 = &conn->ns_conn->flags;
        *puVar2 = *puVar2 | 1;
      }
      else {
        uVar28 = (pnVar4->recv_iobuf).len;
        uVar29 = (ulong)uVar16;
        if (uVar16 != 0 && uVar29 <= uVar28) {
          pcVar18 = (pnVar4->recv_iobuf).buf;
          memmove(pcVar18,pcVar18 + uVar29,uVar28 - uVar29);
          psVar1 = &(pnVar4->recv_iobuf).len;
          *psVar1 = *psVar1 - uVar29;
        }
      }
    }
    if ((conn->mg_conn).is_websocket == 0) {
      if ((long)conn->request_len + conn->cl <= conn->num_bytes_recv) {
        (conn->mg_conn).content = (conn->ns_conn->recv_iobuf).buf;
        if (((conn->server == (mg_server *)0x0) ||
            (p_Var5 = conn->server->event_handler, p_Var5 == (mg_handler_t)0x0)) ||
           (iVar14 = (*p_Var5)(&conn->mg_conn,MG_REQUEST), iVar14 == 0)) {
          open_local_endpoint(conn,1);
        }
        else if (iVar14 == 1) {
          if ((conn->ns_conn->flags & 0x100000) != 0) {
            ns_out(conn->ns_conn,"0\r\n\r\n",5);
          }
          close_local_endpoint(conn);
        }
      }
    }
    else {
      while( true ) {
        pbVar6 = (byte *)(conn->ns_conn->recv_iobuf).buf;
        uVar31 = (uint)(conn->ns_conn->recv_iobuf).len;
        uVar17 = 0;
        uVar16 = 0;
        uVar27 = 0;
        if (1 < (int)uVar31) {
          uVar27 = pbVar6[1] & 0x7f;
          uVar17 = pbVar6[1] >> 5 & 4;
          if (uVar31 < uVar17 || 0x7d < (byte)uVar27) {
            if (((byte)uVar27 == 0x7e) && (uVar16 = uVar17 + 4, uVar16 <= uVar31)) {
              uVar27 = (uint)(ushort)(*(ushort *)(pbVar6 + 2) << 8 | *(ushort *)(pbVar6 + 2) >> 8);
            }
            else {
              uVar16 = uVar17 | 10;
              if (uVar31 < uVar16) {
                uVar16 = 0;
                uVar27 = 0;
              }
              else {
                uVar27 = *(uint *)(pbVar6 + 6);
                uVar27 = uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                         uVar27 << 0x18;
              }
            }
          }
          else {
            uVar16 = uVar17 | 2;
          }
        }
        uVar26 = uVar27 + uVar16;
        if ((uVar26 == 0 || SCARRY4(uVar27,uVar16) != (int)uVar26 < 0) ||
           ((int)uVar31 < (int)uVar26)) break;
        (conn->mg_conn).content_len = (long)(int)uVar27;
        pbVar24 = pbVar6 + uVar16;
        (conn->mg_conn).content = (char *)pbVar24;
        (conn->mg_conn).wsbits = (uint)*pbVar6;
        if ((uVar17 != 0) && (0 < (int)uVar27)) {
          uVar28 = 0;
          do {
            pbVar24[uVar28] = pbVar24[uVar28] ^ pbVar24[(ulong)((uint)uVar28 & 3) - (ulong)uVar17];
            uVar28 = uVar28 + 1;
          } while (uVar27 != uVar28);
        }
        if (((conn->server == (mg_server *)0x0) ||
            (p_Var5 = conn->server->event_handler, p_Var5 == (mg_handler_t)0x0)) ||
           (iVar14 = (*p_Var5)(&conn->mg_conn,MG_REQUEST), iVar14 == 0)) {
          pnVar30 = conn->ns_conn;
          pnVar30->flags = pnVar30->flags | 1;
        }
        else {
          pnVar30 = conn->ns_conn;
        }
        uVar29 = (ulong)uVar26;
        uVar28 = (pnVar30->recv_iobuf).len;
        if (uVar29 <= uVar28) {
          pcVar18 = (pnVar30->recv_iobuf).buf;
          memmove(pcVar18,pcVar18 + uVar29,uVar28 - uVar29);
          psVar1 = &(pnVar30->recv_iobuf).len;
          *psVar1 = *psVar1 - uVar29;
        }
      }
    }
    eVar15 = conn->endpoint_type;
  }
  if ((eVar15 == EP_PUT) && ((pnVar4->recv_iobuf).len != 0)) {
    pnVar4 = conn->ns_conn;
    sVar20 = (pnVar4->recv_iobuf).len;
    if (conn->cl < (long)sVar20) {
      sVar20 = conn->cl;
    }
    uVar28 = write((conn->endpoint).fd,(pnVar4->recv_iobuf).buf,sVar20);
    if ((int)uVar28 < 1) {
      lVar22 = conn->cl;
    }
    else {
      uVar28 = uVar28 & 0x7fffffff;
      if ((uVar28 != 0) && (uVar29 = (pnVar4->recv_iobuf).len, uVar28 <= uVar29)) {
        pcVar18 = (pnVar4->recv_iobuf).buf;
        memmove(pcVar18,pcVar18 + uVar28,uVar29 - uVar28);
        psVar1 = &(pnVar4->recv_iobuf).len;
        *psVar1 = *psVar1 - uVar28;
      }
      lVar22 = conn->cl - uVar28;
      conn->cl = lVar22;
    }
    if (lVar22 < 1) {
      close_local_endpoint(conn);
    }
  }
  return;
}

Assistant:

static void on_recv_data(struct connection *conn) {
  struct iobuf *io = &conn->ns_conn->recv_iobuf;
  int n;

  if (conn->endpoint_type == EP_PROXY) {
    if (conn->endpoint.nc != NULL) do_proxy(conn);
    return;
  }

  try_parse(conn);
  DBG(("%p %d %lu %d", conn, conn->request_len, (unsigned long)io->len,
       conn->ns_conn->flags));
  if (conn->request_len < 0 ||
      (conn->request_len > 0 && !is_valid_uri(conn->mg_conn.uri))) {
    send_http_error(conn, 400, NULL);
  } else if (conn->request_len == 0 && io->len > MAX_REQUEST_SIZE) {
    send_http_error(conn, 413, NULL);
  } else if (conn->request_len > 0 &&
             strcmp(conn->mg_conn.http_version, "1.0") != 0 &&
             strcmp(conn->mg_conn.http_version, "1.1") != 0) {
    send_http_error(conn, 505, NULL);
  } else if (conn->request_len > 0 && conn->endpoint_type == EP_NONE) {
#ifndef MONGOOSE_NO_WEBSOCKET
    send_websocket_handshake_if_requested(&conn->mg_conn);
#endif
    send_continue_if_expected(conn);
    open_local_endpoint(conn, 0);
  }

#ifndef MONGOOSE_NO_CGI
  if (conn->endpoint_type == EP_CGI && conn->endpoint.nc != NULL) {
    ns_forward(conn->ns_conn, conn->endpoint.nc);
  }
#endif
  if (conn->endpoint_type == EP_USER) {
    conn->mg_conn.content = io->buf;
    conn->mg_conn.content_len = io->len;
    n = call_user(conn, MG_RECV);
    if (n < 0) {
      conn->ns_conn->flags |= NSF_FINISHED_SENDING_DATA;
    } else if ((size_t) n <= io->len) {
      iobuf_remove(io, n);
    }
    call_request_handler_if_data_is_buffered(conn);
  }
#ifndef MONGOOSE_NO_DAV
  if (conn->endpoint_type == EP_PUT && io->len > 0) {
    forward_put_data(conn);
  }
#endif
}